

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O3

double __thiscall ON_Line::MaximumDistanceTo(ON_Line *this,ON_Line *L)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = ON_3dPoint::DistanceTo(&this->from,&L->from);
  dVar2 = ON_3dPoint::DistanceTo(&this->to,&L->from);
  if (dVar2 <= dVar1) {
    dVar2 = dVar1;
  }
  dVar3 = ON_3dPoint::DistanceTo(&this->from,&L->to);
  dVar1 = ON_3dPoint::DistanceTo(&this->to,&L->to);
  if (dVar1 <= dVar3) {
    dVar1 = dVar3;
  }
  if (dVar1 <= dVar2) {
    dVar1 = dVar2;
  }
  return dVar1;
}

Assistant:

double ON_Line::MaximumDistanceTo( const ON_Line& L ) const
{
  double a, b;
  a = MaximumDistanceTo(L.from);
  b = MaximumDistanceTo(L.to);
  return ((a<b)?b:a);
}